

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateOneNamespace
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *prefix,xmlNsPtr ns,
              xmlChar *value)

{
  int iVar1;
  uint uVar2;
  xmlChar **elem_00;
  xmlEnumerationPtr local_a8;
  xmlEnumerationPtr tree_1;
  xmlNotationPtr nota;
  xmlEnumerationPtr tree;
  xmlChar *fullname;
  xmlChar fn [50];
  int ret;
  int val;
  xmlAttributePtr attrDecl;
  xmlChar *value_local;
  xmlNsPtr ns_local;
  xmlChar *prefix_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  _ret = (xmlAttributePtr)0x0;
  stack0xffffffffffffffb0 = 1;
  if (doc == (xmlDocPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else if ((elem == (xmlNodePtr)0x0) || (elem->name == (xmlChar *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else if ((ns == (xmlNsPtr)0x0) || (ns->href == (xmlChar *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    if (prefix != (xmlChar *)0x0) {
      elem_00 = (xmlChar **)xmlBuildQName(elem->name,prefix,(xmlChar *)&fullname,0x32);
      if (elem_00 == (xmlChar **)0x0) {
        xmlVErrMemory(ctxt,"Validating namespace");
        return 0;
      }
      if (ns->prefix == (xmlChar *)0x0) {
        _ret = xmlGetDtdAttrDesc(doc->intSubset,(xmlChar *)elem_00,"xmlns");
        if ((_ret == (xmlAttributePtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) {
          _ret = xmlGetDtdAttrDesc(doc->extSubset,(xmlChar *)elem_00,"xmlns");
        }
      }
      else {
        _ret = xmlGetDtdQAttrDesc(doc->intSubset,(xmlChar *)elem_00,ns->prefix,"xmlns");
        if ((_ret == (xmlAttributePtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) {
          _ret = xmlGetDtdQAttrDesc(doc->extSubset,(xmlChar *)elem_00,ns->prefix,"xmlns");
        }
      }
      if ((elem_00 != &fullname) && (elem_00 != (xmlChar **)elem->name)) {
        (*xmlFree)(elem_00);
      }
    }
    if (_ret == (xmlAttributePtr)0x0) {
      if (ns->prefix == (xmlChar *)0x0) {
        _ret = xmlGetDtdAttrDesc(doc->intSubset,elem->name,"xmlns");
        if ((_ret == (xmlAttributePtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) {
          _ret = xmlGetDtdAttrDesc(doc->extSubset,elem->name,"xmlns");
        }
      }
      else {
        _ret = xmlGetDtdQAttrDesc(doc->intSubset,elem->name,ns->prefix,"xmlns");
        if ((_ret == (xmlAttributePtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) {
          _ret = xmlGetDtdQAttrDesc(doc->extSubset,elem->name,ns->prefix,"xmlns");
        }
      }
    }
    if (_ret == (xmlAttributePtr)0x0) {
      if (ns->prefix == (xmlChar *)0x0) {
        xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_ATTRIBUTE,
                        "No declaration for attribute xmlns of element %s\n",elem->name,
                        (xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_ATTRIBUTE,
                        "No declaration for attribute xmlns:%s of element %s\n",ns->prefix,
                        elem->name,(xmlChar *)0x0);
      }
      ctxt_local._4_4_ = 0;
    }
    else {
      iVar1 = xmlValidateAttributeValueInternal(doc,_ret->atype,value);
      if (iVar1 == 0) {
        if (ns->prefix == (xmlChar *)0x0) {
          xmlErrValidNode(ctxt,elem,XML_DTD_INVALID_DEFAULT,
                          "Syntax of value for attribute xmlns of %s is not valid\n",elem->name,
                          (xmlChar *)0x0,(xmlChar *)0x0);
        }
        else {
          xmlErrValidNode(ctxt,elem,XML_DTD_INVALID_DEFAULT,
                          "Syntax of value for attribute xmlns:%s of %s is not valid\n",ns->prefix,
                          elem->name,(xmlChar *)0x0);
        }
        stack0xffffffffffffffb0 = 0;
      }
      if ((_ret->def == XML_ATTRIBUTE_FIXED) &&
         (iVar1 = xmlStrEqual(value,_ret->defaultValue), iVar1 == 0)) {
        if (ns->prefix == (xmlChar *)0x0) {
          xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_DEFAULT,
                          "Value for attribute xmlns of %s is different from default \"%s\"\n",
                          elem->name,_ret->defaultValue,(xmlChar *)0x0);
        }
        else {
          xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_DEFAULT,
                          "Value for attribute xmlns:%s of %s is different from default \"%s\"\n",
                          ns->prefix,elem->name,_ret->defaultValue);
        }
        stack0xffffffffffffffb0 = 0;
      }
      if (_ret->atype == XML_ATTRIBUTE_NOTATION) {
        nota = (xmlNotationPtr)_ret->tree;
        tree_1 = (xmlEnumerationPtr)xmlGetDtdNotationDesc(doc->intSubset,value);
        if ((xmlNotationPtr)tree_1 == (xmlNotationPtr)0x0) {
          tree_1 = (xmlEnumerationPtr)xmlGetDtdNotationDesc(doc->extSubset,value);
        }
        if (tree_1 == (xmlEnumerationPtr)0x0) {
          if (ns->prefix == (xmlChar *)0x0) {
            xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_NOTATION,
                            "Value \"%s\" for attribute xmlns of %s is not a declared Notation\n",
                            value,elem->name,(xmlChar *)0x0);
          }
          else {
            xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_NOTATION,
                            "Value \"%s\" for attribute xmlns:%s of %s is not a declared Notation\n"
                            ,value,ns->prefix,elem->name);
          }
          stack0xffffffffffffffb0 = 0;
        }
        while ((nota != (xmlNotationPtr)0x0 &&
               (iVar1 = xmlStrEqual(nota->PublicID,value), iVar1 == 0))) {
          nota = (xmlNotationPtr)nota->name;
        }
        if (nota == (xmlNotationPtr)0x0) {
          if (ns->prefix == (xmlChar *)0x0) {
            xmlErrValidNode(ctxt,elem,XML_DTD_NOTATION_VALUE,
                            "Value \"%s\" for attribute xmlns of %s is not among the enumerated notations\n"
                            ,value,elem->name,(xmlChar *)0x0);
          }
          else {
            xmlErrValidNode(ctxt,elem,XML_DTD_NOTATION_VALUE,
                            "Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated notations\n"
                            ,value,ns->prefix,elem->name);
          }
          stack0xffffffffffffffb0 = 0;
        }
      }
      if (_ret->atype == XML_ATTRIBUTE_ENUMERATION) {
        local_a8 = _ret->tree;
        while ((local_a8 != (xmlEnumerationPtr)0x0 &&
               (iVar1 = xmlStrEqual(local_a8->name,value), iVar1 == 0))) {
          local_a8 = local_a8->next;
        }
        if (local_a8 == (xmlEnumerationPtr)0x0) {
          if (ns->prefix == (xmlChar *)0x0) {
            xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,
                            "Value \"%s\" for attribute xmlns of %s is not among the enumerated set\n"
                            ,value,elem->name,(xmlChar *)0x0);
          }
          else {
            xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,
                            "Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated set\n"
                            ,value,ns->prefix,elem->name);
          }
          stack0xffffffffffffffb0 = 0;
        }
      }
      if ((_ret->def == XML_ATTRIBUTE_FIXED) &&
         (iVar1 = xmlStrEqual(_ret->defaultValue,value), iVar1 == 0)) {
        if (ns->prefix == (xmlChar *)0x0) {
          xmlErrValidNode(ctxt,elem,XML_DTD_ELEM_NAMESPACE,
                          "Value for attribute xmlns of %s must be \"%s\"\n",elem->name,
                          _ret->defaultValue,(xmlChar *)0x0);
        }
        else {
          xmlErrValidNode(ctxt,elem,XML_DTD_ELEM_NAMESPACE,
                          "Value for attribute xmlns:%s of %s must be \"%s\"\n",ns->prefix,
                          elem->name,_ret->defaultValue);
        }
        stack0xffffffffffffffb0 = 0;
      }
      if (ns->prefix == (xmlChar *)0x0) {
        uVar2 = xmlValidateAttributeValue2(ctxt,doc,"xmlns",_ret->atype,value);
        register0x00000000 = uVar2 & stack0xffffffffffffffb0;
      }
      else {
        uVar2 = xmlValidateAttributeValue2(ctxt,doc,ns->prefix,_ret->atype,value);
        register0x00000000 = uVar2 & stack0xffffffffffffffb0;
      }
      ctxt_local._4_4_ = stack0xffffffffffffffb0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidateOneNamespace(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
xmlNodePtr elem, const xmlChar *prefix, xmlNsPtr ns, const xmlChar *value) {
    /* xmlElementPtr elemDecl; */
    xmlAttributePtr attrDecl =  NULL;
    int val;
    int ret = 1;

    CHECK_DTD;
    if ((elem == NULL) || (elem->name == NULL)) return(0);
    if ((ns == NULL) || (ns->href == NULL)) return(0);

    if (prefix != NULL) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, prefix, fn, 50);
	if (fullname == NULL) {
	    xmlVErrMemory(ctxt, "Validating namespace");
	    return(0);
	}
	if (ns->prefix != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullname,
		                          ns->prefix, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullname,
					  ns->prefix, BAD_CAST "xmlns");
	} else {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, fullname,
		                         BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset, fullname,
			                 BAD_CAST "xmlns");
	}
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    if (attrDecl == NULL) {
	if (ns->prefix != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name,
		                          ns->prefix, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name,
					      ns->prefix, BAD_CAST "xmlns");
	} else {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset,
		                         elem->name, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset,
					     elem->name, BAD_CAST "xmlns");
	}
    }


    /* Validity Constraint: Attribute Value Type */
    if (attrDecl == NULL) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
		   "No declaration for attribute xmlns:%s of element %s\n",
		   ns->prefix, elem->name, NULL);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
		   "No declaration for attribute xmlns of element %s\n",
		   elem->name, NULL, NULL);
	}
	return(0);
    }

    val = xmlValidateAttributeValueInternal(doc, attrDecl->atype, value);
    if (val == 0) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_DEFAULT,
	       "Syntax of value for attribute xmlns:%s of %s is not valid\n",
		   ns->prefix, elem->name, NULL);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_DEFAULT,
	       "Syntax of value for attribute xmlns of %s is not valid\n",
		   elem->name, NULL, NULL);
	}
        ret = 0;
    }

    /* Validity constraint: Fixed Attribute Default */
    if (attrDecl->def == XML_ATTRIBUTE_FIXED) {
	if (!xmlStrEqual(value, attrDecl->defaultValue)) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
       "Value for attribute xmlns:%s of %s is different from default \"%s\"\n",
		       ns->prefix, elem->name, attrDecl->defaultValue);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
       "Value for attribute xmlns of %s is different from default \"%s\"\n",
		       elem->name, attrDecl->defaultValue, NULL);
	    }
	    ret = 0;
	}
    }

    /*
     * Casting ns to xmlAttrPtr is wrong. We'd need separate functions
     * xmlAddID and xmlAddRef for namespace declarations, but it makes
     * no practical sense to use ID types anyway.
     */
#if 0
    /* Validity Constraint: ID uniqueness */
    if (attrDecl->atype == XML_ATTRIBUTE_ID) {
        if (xmlAddID(ctxt, doc, value, (xmlAttrPtr) ns) == NULL)
	    ret = 0;
    }

    if ((attrDecl->atype == XML_ATTRIBUTE_IDREF) ||
	(attrDecl->atype == XML_ATTRIBUTE_IDREFS)) {
        if (xmlAddRef(ctxt, doc, value, (xmlAttrPtr) ns) == NULL)
	    ret = 0;
    }
#endif

    /* Validity Constraint: Notation Attributes */
    if (attrDecl->atype == XML_ATTRIBUTE_NOTATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
        xmlNotationPtr nota;

        /* First check that the given NOTATION was declared */
	nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	if (nota == NULL)
	    nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	if (nota == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute xmlns:%s of %s is not a declared Notation\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute xmlns of %s is not a declared Notation\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
        }

	/* Second, verify that it's among the list */
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated notations\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute xmlns of %s is not among the enumerated notations\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
	}
    }

    /* Validity Constraint: Enumeration */
    if (attrDecl->atype == XML_ATTRIBUTE_ENUMERATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
"Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated set\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
"Value \"%s\" for attribute xmlns of %s is not among the enumerated set\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
	}
    }

    /* Fixed Attribute Default */
    if ((attrDecl->def == XML_ATTRIBUTE_FIXED) &&
        (!xmlStrEqual(attrDecl->defaultValue, value))) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Value for attribute xmlns:%s of %s must be \"%s\"\n",
		   ns->prefix, elem->name, attrDecl->defaultValue);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Value for attribute xmlns of %s must be \"%s\"\n",
		   elem->name, attrDecl->defaultValue, NULL);
	}
        ret = 0;
    }

    /* Extra check for the attribute value */
    if (ns->prefix != NULL) {
	ret &= xmlValidateAttributeValue2(ctxt, doc, ns->prefix,
					  attrDecl->atype, value);
    } else {
	ret &= xmlValidateAttributeValue2(ctxt, doc, BAD_CAST "xmlns",
					  attrDecl->atype, value);
    }

    return(ret);
}